

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

void __thiscall lzham::symbol_codec::remove_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  byte *pbVar5;
  
  if (num_bits != 0) {
    iVar4 = this->m_bit_count;
    if (iVar4 < (int)num_bits) {
      pbVar2 = this->m_pDecode_buf_next;
      pbVar5 = this->m_pDecode_buf_end;
      do {
        if (pbVar2 == pbVar5) {
          if (this->m_decode_buf_eof == false) {
            (*this->m_pDecode_need_bytes_func)
                      ((long)pbVar5 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                       &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
            pbVar2 = this->m_pDecode_buf;
            pbVar5 = pbVar2 + this->m_decode_buf_size;
            this->m_pDecode_buf_end = pbVar5;
            this->m_pDecode_buf_next = pbVar2;
            if (0 < (long)this->m_decode_buf_size) goto LAB_0011d57c;
          }
          uVar3 = 0;
        }
        else {
LAB_0011d57c:
          this->m_pDecode_buf_next = pbVar2 + 1;
          uVar3 = (ulong)*pbVar2;
          pbVar2 = pbVar2 + 1;
        }
        iVar1 = this->m_bit_count;
        iVar4 = iVar1 + 8;
        this->m_bit_count = iVar4;
        uVar3 = uVar3 << (0x38U - (char)iVar1 & 0x3f) | this->m_bit_buf;
        this->m_bit_buf = uVar3;
      } while (iVar4 < (int)num_bits);
    }
    else {
      uVar3 = this->m_bit_buf;
    }
    this->m_bit_buf = uVar3 << ((byte)num_bits & 0x3f);
    this->m_bit_count = iVar4 - num_bits;
  }
  return;
}

Assistant:

void symbol_codec::remove_bits(uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);

      if (!num_bits)
         return;

      while (m_bit_count < (int)num_bits)
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         LZHAM_ASSERT(m_bit_count <= cBitBufSize);

         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      m_bit_buf <<= num_bits;
      m_bit_count -= num_bits;
   }